

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O1

void __thiscall
SplitOnceTest_random_vector_Test<signed_char>::TestBody
          (SplitOnceTest_random_vector_Test<signed_char> *this)

{
  void *pvVar1;
  char in_R8B;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  pair<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  split_result;
  RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_> data;
  AssertHelper local_c0 [8];
  Message local_b8;
  undefined7 uStack_b7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  pointer local_98;
  pair<std::vector<signed_char,_std::allocator<signed_char>_>,_std::vector<signed_char,_std::allocator<signed_char>_>_>
  local_90;
  RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_> local_60;
  
  RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
  RandomTestData(&local_60,'\0',0,0);
  jessilib::
  split_once<std::vector<signed_char,std::allocator<signed_char>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::vector<signed_char,std::allocator<signed_char>>>,signed_char>
            (&local_90,
             (jessilib *)
             local_60.m_str.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
              )local_60.m_str.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (__normal_iterator<const_signed_char_*,_std::vector<signed_char,_std::allocator<signed_char>_>_>
              )0x0,in_R8B);
  testing::internal::
  CmpHelperEQ<std::vector<signed_char,std::allocator<signed_char>>,std::vector<signed_char,std::allocator<signed_char>>>
            ((internal *)local_a8,"split_result.first","data.m_tokens[0]",&local_90.first,
             local_60.m_tokens.
             super__Vector_base<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message(&local_b8);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=(local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((long *)CONCAT71(uStack_b7,local_b8) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_b7,local_b8) + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  RandomTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
  get_remainder((vector<signed_char,_std::allocator<signed_char>_> *)local_a8,&local_60,1);
  testing::internal::
  CmpHelperEQ<std::vector<signed_char,std::allocator<signed_char>>,std::vector<signed_char,std::allocator<signed_char>>>
            ((internal *)&local_b8,"split_result.second","data.get_remainder(1)",&local_90.second,
             (vector<signed_char,_std::allocator<signed_char>_> *)local_a8);
  pvVar1 = (void *)CONCAT71(local_a8._1_7_,local_a8[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_98 - (long)pvVar1);
  }
  if (local_b8 == (Message)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((long *)CONCAT71(local_a8._1_7_,local_a8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 8))();
    }
  }
  if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_b0,local_b0);
  }
  if (local_90.second.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.second.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.second.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.second.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.first.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.first.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.first.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.first.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector(&local_60.m_tokens);
  if ((jessilib *)
      local_60.m_str.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (jessilib *)0x0) {
    operator_delete(local_60.m_str.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.m_str.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.m_str.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.m_delim.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.m_delim.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.m_delim.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.m_delim.
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(SplitOnceTest, random_vector) {
	using vector_type = std::vector<TypeParam>;
	RandomTestData<TypeParam, vector_type> data{};
	std::pair<vector_type, vector_type> split_result = split_once<vector_type>(data.m_str, default_delim<TypeParam>);

	EXPECT_EQ(split_result.first, data.m_tokens[0]);
	EXPECT_EQ(split_result.second, data.get_remainder(1));
}